

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void decode_rr_idirect(DisasContext_conflict14 *ctx)

{
  TCGContext_conflict9 *tcg_ctx_00;
  uint32_t uVar1;
  uint32_t uVar2;
  TCGv_i32 arg2;
  TCGv_i32 helper_tmp;
  int r1;
  uint32_t op2;
  TCGContext_conflict9 *tcg_ctx;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = extract32(ctx->opcode,0x14,8);
  uVar2 = extract32(ctx->opcode,8,4);
  switch(uVar1) {
  case 0:
    arg2 = tcg_const_i32_tricore(tcg_ctx_00,ctx->pc_succ_insn);
    gen_helper_call(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2);
    tcg_temp_free_i32(tcg_ctx_00,arg2);
    tcg_gen_andi_i32_tricore(tcg_ctx_00,tcg_ctx_00->cpu_PC,tcg_ctx_00->cpu_gpr_a[(int)uVar2],-2);
    break;
  case 1:
    gen_fcall_save_ctx(ctx);
    tcg_gen_andi_i32_tricore(tcg_ctx_00,tcg_ctx_00->cpu_PC,tcg_ctx_00->cpu_gpr_a[(int)uVar2],-2);
    break;
  case 2:
    tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_gpr_a[0xb],ctx->pc_succ_insn);
    tcg_gen_andi_i32_tricore(tcg_ctx_00,tcg_ctx_00->cpu_PC,tcg_ctx_00->cpu_gpr_a[(int)uVar2],-2);
    break;
  case 3:
    tcg_gen_andi_i32_tricore(tcg_ctx_00,tcg_ctx_00->cpu_PC,tcg_ctx_00->cpu_gpr_a[(int)uVar2],-2);
    break;
  default:
    generate_trap(ctx,2,1);
  }
  tcg_gen_exit_tb_tricore(tcg_ctx_00,(TranslationBlock *)0x0,0);
  (ctx->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static void decode_rr_idirect(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    uint32_t op2;
    int r1;

    op2 = MASK_OP_RR_OP2(ctx->opcode);
    r1 = MASK_OP_RR_S1(ctx->opcode);

    switch (op2) {
    case OPC2_32_RR_JI:
        tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_PC, tcg_ctx->cpu_gpr_a[r1], ~0x1);
        break;
    case OPC2_32_RR_JLI:
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr_a[11], ctx->pc_succ_insn);
        tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_PC, tcg_ctx->cpu_gpr_a[r1], ~0x1);
        break;
    case OPC2_32_RR_CALLI:
        gen_helper_1arg(tcg_ctx, call, ctx->pc_succ_insn);
        tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_PC, tcg_ctx->cpu_gpr_a[r1], ~0x1);
        break;
    case OPC2_32_RR_FCALLI:
        gen_fcall_save_ctx(ctx);
        tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_PC, tcg_ctx->cpu_gpr_a[r1], ~0x1);
        break;
    default:
        generate_trap(ctx, TRAPC_INSN_ERR, TIN2_IOPC);
    }
    tcg_gen_exit_tb(tcg_ctx, NULL, 0);
    ctx->base.is_jmp = DISAS_NORETURN;
}